

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC.cpp
# Opt level: O3

uint CRC::ComputeCrc32(uint polynomial,uchar *buffer,uint size)

{
  int i;
  ulong uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint auStack_408 [258];
  
  uVar1 = 0;
  do {
    iVar2 = 8;
    uVar5 = uVar1 & 0xffffffff;
    do {
      uVar4 = -((uint)uVar5 & 1) & polynomial ^ (uint)(uVar5 >> 1);
      uVar5 = (ulong)uVar4;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    auStack_408[uVar1] = uVar4;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x100);
  if (size == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0xffffffff;
    lVar3 = 0;
    do {
      uVar4 = uVar4 >> 8 ^ auStack_408[(byte)(buffer[lVar3] ^ (byte)uVar4)];
      lVar3 = lVar3 + 1;
    } while (size != (uint)lVar3);
    uVar4 = ~uVar4;
  }
  return uVar4;
}

Assistant:

unsigned int CRC::ComputeCrc32(unsigned int polynomial, const unsigned char* buffer, unsigned int size)
{
   // Compute the array
   int crc_array [ 256 ];

   for (int i = 0; i < 256; i++)
   {
      unsigned int crc = i;
      for (int b = 0; b < 8; b++)
      {
         if ((crc & 1) == 1)
         {
            crc = (polynomial ^ (crc >> 1));
         }
         else
         {
            crc >>= 1;
         }
      }
      crc_array[i] = crc;
   }

   unsigned int crc = ~0;

   while (size--)
   {
      crc = crc_array[(crc ^ *buffer++) & 0xff] ^ (crc >> 8);
   }
   return crc ^ ~0;
}